

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSingularFieldHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  _func_void_FieldDescriptor_ptr *p_Var1;
  EnforceOptimizeMode EVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  LogMessage *other;
  char *pcVar7;
  Hex local_70;
  undefined1 local_60 [56];
  
  if (*(char *)(*(long *)(field + 0x78) + 0x4f) == '\x01') {
    Formatter::operator()<>
              (format,
               "inline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _weak_field_map_.Has($number$);\n}\n"
              );
    return;
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) != 3) {
    if (field[0x42] == (FieldDescriptor)0x0) {
      plVar6 = (long *)(*(long *)(field + 0x50) + 0x28);
    }
    else if (*(long *)(field + 0x60) == 0) {
      plVar6 = (long *)(*(long *)(field + 0x28) + 0x80);
    }
    else {
      plVar6 = (long *)(*(long *)(field + 0x60) + 0x50);
    }
    iVar3 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(int)((ulong)((long)field - *plVar6) >> 3) * 0x286bca1b];
    if (iVar3 < 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x325);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_60,"CHECK failed: (has_bit_index) >= (0): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_60);
    }
    p_Var1 = (_func_void_FieldDescriptor_ptr *)(local_60 + 0x10);
    local_60._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"has_array_index","");
    iVar5 = iVar3 + 0x1f;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    local_70.value = CONCAT44(local_70.value._4_4_,iVar5 >> 5);
    Formatter::Set<int>(format,(string *)local_60,(int *)&local_70);
    if ((_func_void_FieldDescriptor_ptr *)local_60._0_8_ != p_Var1) {
      operator_delete((void *)local_60._0_8_);
    }
    local_60._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"has_mask","");
    local_70.value = 1L << ((byte)iVar3 & 0x1f);
    local_70.spec = ZERO_PAD_8;
    Formatter::Set<google::protobuf::strings::Hex>(format,(string *)local_60,&local_70);
    if ((_func_void_FieldDescriptor_ptr *)local_60._0_8_ != p_Var1) {
      operator_delete((void *)local_60._0_8_);
    }
    Formatter::operator()<>
              (format,
               "inline bool $classname$::_internal_has_$name$() const {\n  bool value = (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n"
              );
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_60._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70.value = (uint64)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_60,
                 (FieldDescriptor **)&local_70);
    }
    uVar4 = *(uint *)(field + 0x38);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar4 * 4) != 10) goto LAB_0028f6d9;
    if ((*(char *)(*(long *)(field + 0x78) + 0x4d) == '\x01') && (*(int *)(field + 0x3c) != 3)) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_60._0_8_ = FieldDescriptor::TypeOnceInit;
        local_70.value = (uint64)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_60,
                   (FieldDescriptor **)&local_70);
        uVar4 = *(uint *)(field + 0x38);
      }
      if (uVar4 != 0xb) goto LAB_0028f6ca;
      EVar2 = (this->options_).enforce_mode;
      if (EVar2 == kSpeed) {
        if ((this->options_).opensource_runtime == true) goto LAB_0028f6ca;
      }
      else if (((EVar2 == kLiteRuntime) ||
               (*(int *)(*(long *)(*(long *)(field + 0x28) + 0x88) + 0xa4) == 3)) ||
              (((this->options_).opensource_runtime & 1U) != 0)) goto LAB_0028f6ca;
    }
    else {
LAB_0028f6ca:
      Formatter::operator()<>(format,"  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }
LAB_0028f6d9:
    pcVar7 = 
    "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
    ;
    goto LAB_0028f6e0;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_60._0_8_ = FieldDescriptor::TypeOnceInit;
    local_70.value = (uint64)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_60,
               (FieldDescriptor **)&local_70);
  }
  uVar4 = *(uint *)(field + 0x38);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar4 * 4) != 10) {
    return;
  }
  if ((*(char *)(*(long *)(field + 0x78) + 0x4d) == '\x01') && (*(int *)(field + 0x3c) != 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_60._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70.value = (uint64)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_60,
                 (FieldDescriptor **)&local_70);
      uVar4 = *(uint *)(field + 0x38);
    }
    if (uVar4 != 0xb) goto LAB_0028f6ab;
    EVar2 = (this->options_).enforce_mode;
    if (EVar2 == kSpeed) {
      if ((this->options_).opensource_runtime == true) goto LAB_0028f6ab;
    }
    else if (((EVar2 == kLiteRuntime) ||
             (*(int *)(*(long *)(*(long *)(field + 0x28) + 0x88) + 0xa4) == 3)) ||
            (((this->options_).opensource_runtime & 1U) != 0)) goto LAB_0028f6ab;
    pcVar7 = 
    "inline bool $classname$::_internal_has_$name$() const {\n  return !$name$_.IsCleared();\n}\n";
  }
  else {
LAB_0028f6ab:
    pcVar7 = 
    "inline bool $classname$::_internal_has_$name$() const {\n  return this != internal_default_instance() && $name$_ != nullptr;\n}\n"
    ;
  }
  Formatter::operator()<>(format,pcVar7);
  pcVar7 = 
  "inline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
  ;
LAB_0028f6e0:
  Formatter::operator()<>(format,pcVar7);
  return;
}

Assistant:

void MessageGenerator::GenerateSingularFieldHasBits(
    const FieldDescriptor* field, Formatter format) {
  if (field->options().weak()) {
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _weak_field_map_.Has($number$);\n"
        "}\n");
    return;
  }
  if (HasFieldPresence(descriptor_->file())) {
    // N.B.: without field presence, we do not use has-bits or generate
    // has_$name$() methods.
    int has_bit_index = has_bit_indices_[field->index()];
    GOOGLE_CHECK_GE(has_bit_index, 0);

    format.Set("has_array_index", has_bit_index / 32);
    format.Set("has_mask",
               strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  bool value = "
        "(_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n");

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsLazy(field, options_)) {
      // We maintain the invariant that for a submessage x, has_x() returning
      // true implies that x_ is not null. By giving this information to the
      // compiler, we allow it to eliminate unnecessary null checks later on.
      format("  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }

    format(
        "  return value;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else {
    // Message fields have a has_$name$() method.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsLazy(field, options_)) {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return !$name$_.IsCleared();\n"
            "}\n");
      } else {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return this != internal_default_instance() "
            "&& $name$_ != nullptr;\n"
            "}\n");
      }
      format(
          "inline bool $classname$::has_$name$() const {\n"
          "$annotate_accessor$"
          "  return _internal_has_$name$();\n"
          "}\n");
    }
  }
}